

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O2

void ReadAxis(aiMatrix4x4 *axis,StreamReaderLE *stream)

{
  float fVar1;
  
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->a4 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->b4 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->c4 = fVar1;
  axis->d4 = 1.0;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->a1 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->b1 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->c1 = fVar1;
  axis->d1 = 0.0;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->a2 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->b2 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->c2 = fVar1;
  axis->d2 = 0.0;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->a3 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->b3 = fVar1;
  fVar1 = Assimp::StreamReader<false,_false>::Get<float>(stream);
  axis->c3 = fVar1;
  axis->d3 = 0.0;
  return;
}

Assistant:

static void ReadAxis(aiMatrix4x4& axis, StreamReaderLE* stream)
{
    axis.a4 = stream->GetF4();
    axis.b4 = stream->GetF4();
    axis.c4 = stream->GetF4();
    axis.d4 = 1;
    axis.a1 = stream->GetF4();
    axis.b1 = stream->GetF4();
    axis.c1 = stream->GetF4();
    axis.d1 = 0;
    axis.a2 = stream->GetF4();
    axis.b2 = stream->GetF4();
    axis.c2 = stream->GetF4();
    axis.d2 = 0;
    axis.a3 = stream->GetF4();
    axis.b3 = stream->GetF4();
    axis.c3 = stream->GetF4();
    axis.d3 = 0;
}